

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O0

bool __thiscall
DIS::IncomingMessage::FindProccessorContainer
          (IncomingMessage *this,uchar id,IPacketProcessor *pp,iterator *containerIter)

{
  bool bVar1;
  pointer ppVar2;
  undefined1 local_40 [8];
  PacketProcessIteratorPair iterPair;
  iterator *containerIter_local;
  IPacketProcessor *pp_local;
  IncomingMessage *pIStack_18;
  uchar id_local;
  IncomingMessage *this_local;
  
  iterPair.second._M_node = (_Base_ptr)containerIter;
  pp_local._7_1_ = id;
  pIStack_18 = this;
  _local_40 = std::
              multimap<unsigned_char,_DIS::IPacketProcessor_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>_>
              ::equal_range(&this->_processors,(key_type *)((long)&pp_local + 7));
  while( true ) {
    bVar1 = std::operator!=((_Self *)local_40,&iterPair.first);
    if (!bVar1) {
      return false;
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>
                         *)local_40);
    if (ppVar2->second == pp) break;
    std::_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_char,_DIS::IPacketProcessor_*>_> *)
               local_40,0);
  }
  *(undefined1 (*) [8])iterPair.second._M_node = local_40;
  return true;
}

Assistant:

bool IncomingMessage::FindProccessorContainer(unsigned char id, const IPacketProcessor* pp, PacketProcessorContainer::iterator &containerIter)
{  
   PacketProcessIteratorPair iterPair = _processors.equal_range(id);

   // Check to make sure that the processor we're trying to add is not already there
   while (iterPair.first != iterPair.second)
   {
      // If this processor with a matching id has a the exact same processor, bail
      if ((iterPair.first)->second == pp)
      {
         containerIter = iterPair.first;
         return true;
      }

      iterPair.first++;
   }

   // No matches were found in the loop
   return false;
}